

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O3

ParticleUpperBound * __thiscall despot::POMDPX::CreateParticleUpperBound(POMDPX *this,string *name)

{
  int iVar1;
  MDPUpperBound *this_00;
  ostream *poVar2;
  
  if (this->is_small_ == false) {
    this_00 = (MDPUpperBound *)operator_new(0x10);
    TrivialParticleUpperBound::TrivialParticleUpperBound
              ((TrivialParticleUpperBound *)this_00,&this->super_DSPOMDP);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)name);
    if (iVar1 == 0) {
      this_00 = (MDPUpperBound *)operator_new(0x10);
      TrivialParticleUpperBound::TrivialParticleUpperBound
                ((TrivialParticleUpperBound *)this_00,&this->super_DSPOMDP);
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)name);
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)name);
        if (iVar1 != 0) {
          poVar2 = std::operator<<((ostream *)&std::cerr,"Unsupported particle upper bound: ");
          poVar2 = std::operator<<(poVar2,(string *)name);
          std::endl<char,std::char_traits<char>>(poVar2);
          exit(1);
        }
      }
      this_00 = (MDPUpperBound *)operator_new(0x38);
      MDPUpperBound::MDPUpperBound(this_00,&this->super_MDP,&this->super_StateIndexer);
    }
  }
  return &this_00->super_ParticleUpperBound;
}

Assistant:

ParticleUpperBound* POMDPX::CreateParticleUpperBound(string name) const {
	if (!is_small_) {
		return new TrivialParticleUpperBound(this);
	}

	const StateIndexer* indexer = this;
	const MDP* mdp = this;

	if (name == "TRIVIAL") {
		return new TrivialParticleUpperBound(this);
	} else if (name == "MDP" || name == "DEFAULT") {
		return new MDPUpperBound(mdp, *indexer);
	} else {
		cerr << "Unsupported particle upper bound: " << name << endl;
		exit(1);
		return NULL;
	}
}